

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

WebPInfoStatus
ParseLossySegmentHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  WebPInfo *pWVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int quantizer [4];
  int filter_strength [4];
  ulong local_68;
  ulong uStack_60;
  WebPInfo *local_58;
  uint local_4c;
  ulong local_48;
  ulong uStack_40;
  
  uVar4 = *bit_pos;
  *bit_pos = uVar4 + 1;
  if (data_size <= uVar4 >> 3) {
    if (webp_info->show_diagnosis != 0) {
      ParseLossySegmentHeader_cold_1();
      return WEBP_INFO_TRUNCATED_DATA;
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  bVar2 = data[uVar4 >> 3] << ((byte)uVar4 & 7);
  printf("  Use segment:      %d\n",(ulong)(bVar2 >> 7));
  if (-1 < (char)bVar2) {
    return WEBP_INFO_OK;
  }
  uVar8 = *bit_pos;
  uVar4 = uVar8 + 1;
  *bit_pos = uVar4;
  if (data_size <= uVar8 >> 3) {
    if (webp_info->show_diagnosis != 0) {
      ParseLossySegmentHeader_cold_2();
      return WEBP_INFO_TRUNCATED_DATA;
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  bVar2 = data[uVar8 >> 3];
  *bit_pos = uVar8 + 2;
  if (data_size <= uVar4 >> 3) {
    if (webp_info->show_diagnosis != 0) {
      ParseLossySegmentHeader_cold_3();
      return WEBP_INFO_TRUNCATED_DATA;
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  uVar6 = 0x80U >> ((byte)uVar8 & 7) & (uint)bVar2;
  bVar5 = (byte)uVar4 & 7;
  bVar2 = data[uVar4 >> 3] << bVar5;
  local_58 = webp_info;
  printf("  Update map:       %d\n  Update data:      %d\n",(ulong)(uVar6 != 0),(ulong)(bVar2 >> 7))
  ;
  if ((char)bVar2 < '\0') {
    local_68 = 0;
    uStack_60 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uVar4 = *bit_pos;
    *bit_pos = uVar4 + 1;
    local_4c = uVar6;
    if (data_size <= uVar4 >> 3) {
      iVar3 = local_58->show_diagnosis;
      goto joined_r0x00104b67;
    }
    uVar8 = (ulong)(uint)(0 << bVar5);
    printf("  Absolute delta:   %d\n",(ulong)((byte)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) >> 7));
    pWVar1 = local_58;
    do {
      uVar4 = *bit_pos;
      *bit_pos = uVar4 + 1;
      if ((data_size <= uVar4 >> 3) ||
         (((char)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) < '\0' &&
          (iVar3 = GetSignedBits(data,data_size,7,(int *)((long)&local_68 + uVar8),bit_pos),
          iVar3 == 0)))) goto LAB_00104b6b;
      uVar8 = uVar8 + 4;
    } while (uVar8 != 0x10);
    lVar9 = 0;
    do {
      uVar4 = *bit_pos;
      *bit_pos = uVar4 + 1;
      if ((data_size <= uVar4 >> 3) ||
         (((char)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) < '\0' &&
          (iVar3 = GetSignedBits(data,data_size,6,(int *)((long)&local_48 + lVar9),bit_pos),
          iVar3 == 0)))) goto LAB_00104b6b;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    printf("  Quantizer:        %d %d %d %d\n",local_68 & 0xffffffff,local_68 >> 0x20,
           uStack_60 & 0xffffffff,uStack_60 >> 0x20);
    printf("  Filter strength:  %d %d %d %d\n",local_48 & 0xffffffff,local_48 >> 0x20,
           uStack_40 & 0xffffffff,uStack_40 >> 0x20);
    uVar6 = local_4c;
  }
  if (uVar6 == 0) {
    return WEBP_INFO_OK;
  }
  local_68 = 0xff000000ff;
  uStack_60 = CONCAT44(uStack_60._4_4_,0xff);
  lVar9 = 0;
  uVar4 = *bit_pos;
  while( true ) {
    uVar8 = uVar4 + 1;
    *bit_pos = uVar8;
    if (data_size <= uVar4 >> 3) break;
    bVar2 = (byte)uVar4 & 7;
    if ((char)(data[uVar4 >> 3] << bVar2) < '\0') {
      *(undefined4 *)((long)&local_68 + lVar9 * 4) = 0;
      iVar3 = 0 << bVar2;
      lVar7 = -8;
      uVar4 = uVar8;
      do {
        uVar8 = uVar4 + 1;
        *bit_pos = uVar8;
        if (data_size <= uVar4 >> 3) goto LAB_00104b78;
        iVar3 = (uint)((byte)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) >> 7) + iVar3 * 2;
        *(int *)((long)&local_68 + lVar9 * 4) = iVar3;
        lVar7 = lVar7 + 1;
        uVar4 = uVar8;
      } while (lVar7 != 0);
    }
    lVar9 = lVar9 + 1;
    uVar4 = uVar8;
    if (lVar9 == 3) {
      printf("  Prob segment:     %d %d %d\n",local_68 & 0xffffffff,local_68 >> 0x20,
             uStack_60 & 0xffffffff);
      return WEBP_INFO_OK;
    }
  }
LAB_00104b78:
  if (local_58->show_diagnosis != 0) {
    ParseLossySegmentHeader_cold_5();
  }
  return WEBP_INFO_TRUNCATED_DATA;
LAB_00104b6b:
  iVar3 = pWVar1->show_diagnosis;
joined_r0x00104b67:
  if (iVar3 == 0) {
    return WEBP_INFO_TRUNCATED_DATA;
  }
  ParseLossySegmentHeader_cold_4();
  return WEBP_INFO_TRUNCATED_DATA;
}

Assistant:

static WebPInfoStatus ParseLossySegmentHeader(const WebPInfo* const webp_info,
                                              const uint8_t* const data,
                                              size_t data_size,
                                              uint64_t* const bit_pos) {
  int use_segment;
  GET_BITS(use_segment, 1);
  printf("  Use segment:      %d\n", use_segment);
  if (use_segment) {
    int update_map, update_data;
    GET_BITS(update_map, 1);
    GET_BITS(update_data, 1);
    printf("  Update map:       %d\n"
           "  Update data:      %d\n",
           update_map, update_data);
    if (update_data) {
      int i, a_delta;
      int quantizer[4] = {0, 0, 0, 0};
      int filter_strength[4] = {0, 0, 0, 0};
      GET_BITS(a_delta, 1);
      printf("  Absolute delta:   %d\n", a_delta);
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(quantizer[i], 7);
      }
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(filter_strength[i], 6);
      }
      printf("  Quantizer:        %d %d %d %d\n", quantizer[0], quantizer[1],
             quantizer[2], quantizer[3]);
      printf("  Filter strength:  %d %d %d %d\n", filter_strength[0],
             filter_strength[1], filter_strength[2], filter_strength[3]);
    }
    if (update_map) {
      int i;
      int prob_segment[3] = {255, 255, 255};
      for (i = 0; i < 3; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_BITS(prob_segment[i], 8);
      }
      printf("  Prob segment:     %d %d %d\n",
             prob_segment[0], prob_segment[1], prob_segment[2]);
    }
  }
  return WEBP_INFO_OK;
}